

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void it<bool(*)()>(string *name,_func_bool *f)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"It ");
  poVar2 = std::operator<<(poVar2,(string *)name);
  std::operator<<(poVar2,"...");
  bVar1 = (*f)();
  pcVar3 = " [Failed]";
  if (bVar1) {
    pcVar3 = " [Pass]";
  }
  std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void it(const std::string &name, TestFunc f, Args... args) {
    std::cout << "It " << name << "...";
    if (f(args...)) {
        std::cout << " [Pass]";
    } else {
        std::cout << " [Failed]";
    }
    std::cout << std::endl;
}